

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_35::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  Impl *pIVar1;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar2;
  uchar *puVar3;
  Fault local_50;
  Fault f;
  uint64_t end;
  undefined1 local_30 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t zeroSize_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  if (zeroSize != 0) {
    lock.ptr = (Impl *)zeroSize;
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    Impl::modified(pIVar1);
    f.exception = (Exception *)((long)&(lock.ptr)->clock + offset);
    if (f.exception < offset) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x351,FAILED,"end >= offset","\"zero() request overflows uint64\"",
                 (char (*) [32])"zero() request overflows uint64");
      _::Debug::Fault::fatal(&local_50);
    }
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    Impl::ensureCapacity(pIVar1,(size_t)f.exception);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    WVar2 = max<unsigned_long&,unsigned_long&>(&pIVar1->size,(unsigned_long *)&f);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    pIVar1->size = WVar2;
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    puVar3 = Array<unsigned_char>::begin(&pIVar1->bytes);
    memset(puVar3 + offset,0,(size_t)lock.ptr);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }